

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_9uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 OVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  uint local_8c;
  int local_88;
  uint dst_6;
  int needed_6;
  uint dst_5;
  int needed_5;
  uint dst_4;
  int needed_4;
  uint dst_3;
  int needed_3;
  uint dst_2;
  int needed_2;
  uint dst_1;
  int needed_1;
  uint dst;
  int needed;
  int available;
  uint val;
  OPJ_UINT32 val8;
  OPJ_UINT32 val7;
  OPJ_UINT32 val6;
  OPJ_UINT32 val5;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffff8); _val1 = _val1 + 8) {
    OVar9 = *pDst_local;
    bVar11 = *(byte *)((long)pDst_local + 1);
    bVar1 = *(byte *)((long)pDst_local + 2);
    bVar2 = *(byte *)((long)pDst_local + 3);
    bVar3 = *(byte *)(pDst_local + 1);
    bVar4 = *(byte *)((long)pDst_local + 5);
    bVar5 = *(byte *)((long)pDst_local + 6);
    pbVar12 = (byte *)(pDst_local + 2);
    bVar6 = *(byte *)((long)pDst_local + 7);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 9);
    bVar7 = *pbVar12;
    pDst[_val1] = (uint)(byte)OVar9 << 1 | (uint)(bVar11 >> 7);
    pDst[_val1 + 1] = (bVar11 & 0x7f) << 2 | (uint)(bVar1 >> 6);
    pDst[_val1 + 2] = (bVar1 & 0x3f) << 3 | (uint)(bVar2 >> 5);
    pDst[_val1 + 3] = (bVar2 & 0x1f) << 4 | (uint)(bVar3 >> 4);
    pDst[_val1 + 4] = (bVar3 & 0xf) << 5 | (uint)(bVar4 >> 3);
    pDst[_val1 + 5] = (bVar4 & 7) << 6 | (uint)(bVar5 >> 2);
    pDst[_val1 + 6] = (bVar5 & 3) << 7 | (uint)(bVar6 >> 1);
    pDst[_val1 + 7] = (bVar6 & 1) << 8 | (uint)bVar7;
  }
  if ((length & 7) != 0) {
    uVar10 = length & 7;
    needed_1 = 9;
    dst_1 = 0;
    bVar11 = (byte)*pDst_local;
    pOVar8 = pDst_local;
    while( true ) {
      pDst_local = (OPJ_INT32 *)((long)pOVar8 + 1);
      needed = (int)bVar11;
      if (needed_1 < 9) break;
      needed_1 = needed_1 + -8;
      dst_1 = (needed | dst_1) << ((byte)needed_1 & 0x1f);
      bVar11 = *(byte *)pDst_local;
      pOVar8 = pDst_local;
    }
    dst = 8 - needed_1;
    pDst[_val1] = (uint)(bVar11 >> (8 - (byte)needed_1 & 0x1f)) &
                  (1 << ((byte)needed_1 & 0x1f)) - 1U | dst_1;
    if (1 < uVar10) {
      needed_2 = 9;
      dst_2 = 0;
      if (dst == 0) {
        needed = (int)*(byte *)pDst_local;
        dst = 8;
        pDst_local = (OPJ_INT32 *)((long)pOVar8 + 2);
      }
      while (bVar11 = (byte)dst, (int)dst < needed_2) {
        needed_2 = needed_2 - dst;
        dst_2 = (needed & (1 << (bVar11 & 0x1f)) - 1U | dst_2) << ((byte)needed_2 & 0x1f);
        needed = (int)(byte)*pDst_local;
        pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        dst = 8;
      }
      dst = dst - needed_2;
      pDst[_val1 + 1] =
           (uint)needed >> (bVar11 - (byte)needed_2 & 0x1f) & (1 << ((byte)needed_2 & 0x1f)) - 1U |
           dst_2;
      if (2 < uVar10) {
        needed_3 = 9;
        dst_3 = 0;
        if (dst == 0) {
          needed = (int)(byte)*pDst_local;
          dst = 8;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        }
        while (bVar11 = (byte)dst, (int)dst < needed_3) {
          needed_3 = needed_3 - dst;
          dst_3 = (needed & (1 << (bVar11 & 0x1f)) - 1U | dst_3) << ((byte)needed_3 & 0x1f);
          needed = (int)(byte)*pDst_local;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          dst = 8;
        }
        dst = dst - needed_3;
        pDst[_val1 + 2] =
             (uint)needed >> (bVar11 - (byte)needed_3 & 0x1f) & (1 << ((byte)needed_3 & 0x1f)) - 1U
             | dst_3;
        if (3 < uVar10) {
          needed_4 = 9;
          dst_4 = 0;
          if (dst == 0) {
            needed = (int)(byte)*pDst_local;
            dst = 8;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          }
          while (bVar11 = (byte)dst, (int)dst < needed_4) {
            needed_4 = needed_4 - dst;
            dst_4 = (needed & (1 << (bVar11 & 0x1f)) - 1U | dst_4) << ((byte)needed_4 & 0x1f);
            needed = (int)(byte)*pDst_local;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            dst = 8;
          }
          dst = dst - needed_4;
          pDst[_val1 + 3] =
               (uint)needed >> (bVar11 - (byte)needed_4 & 0x1f) &
               (1 << ((byte)needed_4 & 0x1f)) - 1U | dst_4;
          if (4 < uVar10) {
            needed_5 = 9;
            dst_5 = 0;
            if (dst == 0) {
              needed = (int)(byte)*pDst_local;
              dst = 8;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            }
            while (bVar11 = (byte)dst, (int)dst < needed_5) {
              needed_5 = needed_5 - dst;
              dst_5 = (needed & (1 << (bVar11 & 0x1f)) - 1U | dst_5) << ((byte)needed_5 & 0x1f);
              needed = (int)(byte)*pDst_local;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              dst = 8;
            }
            dst = dst - needed_5;
            pDst[_val1 + 4] =
                 (uint)needed >> (bVar11 - (byte)needed_5 & 0x1f) &
                 (1 << ((byte)needed_5 & 0x1f)) - 1U | dst_5;
            if (5 < uVar10) {
              needed_6 = 9;
              dst_6 = 0;
              if (dst == 0) {
                needed = (int)(byte)*pDst_local;
                dst = 8;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              }
              while (bVar11 = (byte)dst, (int)dst < needed_6) {
                needed_6 = needed_6 - dst;
                dst_6 = (needed & (1 << (bVar11 & 0x1f)) - 1U | dst_6) << ((byte)needed_6 & 0x1f);
                needed = (int)(byte)*pDst_local;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                dst = 8;
              }
              dst = dst - needed_6;
              pDst[_val1 + 5] =
                   (uint)needed >> (bVar11 - (byte)needed_6 & 0x1f) &
                   (1 << ((byte)needed_6 & 0x1f)) - 1U | dst_6;
              if (6 < uVar10) {
                local_88 = 9;
                local_8c = 0;
                if (dst == 0) {
                  needed = (int)(byte)*pDst_local;
                  dst = 8;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                }
                while ((int)dst < local_88) {
                  local_88 = local_88 - dst;
                  local_8c = (needed & (1 << ((byte)dst & 0x1f)) - 1U | local_8c) <<
                             ((byte)local_88 & 0x1f);
                  needed = (int)(byte)*pDst_local;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                  dst = 8;
                }
                pDst[_val1 + 6] =
                     (uint)needed >> ((byte)dst - (byte)local_88 & 0x1f) &
                     (1 << ((byte)local_88 & 0x1f)) - 1U | local_8c;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_9uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 1) | (val1 >> 7));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7FU) << 2) | (val2 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0x3FU) << 3) | (val3 >> 5));
        pDst[i + 3] = (OPJ_INT32)(((val3 & 0x1FU) << 4) | (val4 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val4 & 0xFU) << 5) | (val5 >> 3));
        pDst[i + 5] = (OPJ_INT32)(((val5 & 0x7U) << 6) | (val6 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val6 & 0x3U) << 7) | (val7 >> 1));
        pDst[i + 7] = (OPJ_INT32)(((val7 & 0x1U) << 8) | (val8));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 9)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 9)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 9)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 9)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 9)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 9)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 9)
                            }
                        }
                    }
                }
            }
        }
    }
}